

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall
FormatterTest_ArgsInDifferentPositions_Test::TestBody
          (FormatterTest_ArgsInDifferentPositions_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  AssertHelper *this_00;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  undefined7 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd5f;
  char *in_stack_fffffffffffffd60;
  string *actual_expression;
  char *in_stack_fffffffffffffd68;
  int line;
  undefined7 in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd77;
  undefined8 in_stack_fffffffffffffd78;
  Type TVar5;
  AssertHelper *in_stack_fffffffffffffd80;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  char (*in_stack_fffffffffffffd98) [4];
  undefined7 in_stack_fffffffffffffda0;
  string *format_str;
  Message *in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  string local_1f8 [32];
  AssertionResult local_1d8 [2];
  undefined4 local_1b4;
  string local_1b0 [32];
  AssertionResult local_190 [2];
  undefined4 local_16c;
  string local_168 [32];
  AssertionResult local_148 [2];
  undefined4 local_124;
  string local_120 [32];
  AssertionResult local_100 [2];
  undefined4 local_dc;
  string local_d8 [32];
  AssertionResult local_b8 [2];
  undefined4 local_94;
  string local_90 [32];
  AssertionResult local_70 [3];
  undefined4 local_3c;
  string local_38 [32];
  AssertionResult local_18;
  
  TVar5 = (Type)((ulong)in_stack_fffffffffffffd78 >> 0x20);
  local_3c = 0x2a;
  fmt::v5::format<char[4],int>
            ((char (*) [4])CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
             (int *)in_stack_fffffffffffffd80);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
             (char (*) [3])CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
             in_stack_fffffffffffffd50);
  std::__cxx11::string::~string(local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd80);
    testing::AssertionResult::failure_message((AssertionResult *)0x12f09a);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd80,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               (int)((ulong)in_stack_fffffffffffffd68 >> 0x20),in_stack_fffffffffffffd60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
               in_stack_fffffffffffffdc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd50);
    testing::Message::~Message((Message *)0x12f0fd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12f155);
  local_94 = 0x2a;
  fmt::v5::format<char[11],int>
            ((char (*) [11])CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
             (int *)in_stack_fffffffffffffd80);
  testing::internal::EqHelper<false>::Compare<char[10],std::__cxx11::string>
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
             (char (*) [10])CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
             in_stack_fffffffffffffd50);
  std::__cxx11::string::~string(local_90);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_70);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd80);
    in_stack_fffffffffffffdc8 =
         (Message *)testing::AssertionResult::failure_message((AssertionResult *)0x12f252);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd80,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               (int)((ulong)in_stack_fffffffffffffd68 >> 0x20),in_stack_fffffffffffffd60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffdd0),in_stack_fffffffffffffdc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd50);
    testing::Message::~Message((Message *)0x12f2b5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12f30d);
  local_dc = 0x2a;
  fmt::v5::format<char[10],int>
            ((char (*) [10])CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
             (int *)in_stack_fffffffffffffd80);
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
             (char (*) [9])CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
             in_stack_fffffffffffffd50);
  std::__cxx11::string::~string(local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd80);
    testing::AssertionResult::failure_message((AssertionResult *)0x12f3fe);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd80,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               (int)((ulong)in_stack_fffffffffffffd68 >> 0x20),in_stack_fffffffffffffd60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffdd0),in_stack_fffffffffffffdc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd50);
    testing::Message::~Message((Message *)0x12f45b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12f4b3);
  local_124 = 0x2a;
  format_str = local_120;
  fmt::v5::format<char[17],int>
            ((char (*) [17])CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
             (int *)in_stack_fffffffffffffd80);
  testing::internal::EqHelper<false>::Compare<char[16],std::__cxx11::string>
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
             (char (*) [16])CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
             in_stack_fffffffffffffd50);
  std::__cxx11::string::~string(local_120);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(local_100);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd80);
    in_stack_fffffffffffffd98 =
         (char (*) [4])testing::AssertionResult::failure_message((AssertionResult *)0x12f5a4);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd80,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               (int)((ulong)in_stack_fffffffffffffd68 >> 0x20),in_stack_fffffffffffffd60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffdd0),in_stack_fffffffffffffdc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd50);
    testing::Message::~Message((Message *)0x12f601);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12f659);
  local_16c = 0x2a;
  fmt::v5::format<char[10],char[7],int>
            ((char (*) [10])format_str,(char (*) [7])CONCAT17(uVar3,in_stack_fffffffffffffda0),
             (int *)in_stack_fffffffffffffd98);
  testing::internal::EqHelper<false>::Compare<char[12],std::__cxx11::string>
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
             (char (*) [12])CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
             in_stack_fffffffffffffd50);
  std::__cxx11::string::~string(local_168);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_148);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd80);
    in_stack_fffffffffffffd80 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x12f751);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd80,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               (int)((ulong)in_stack_fffffffffffffd68 >> 0x20),in_stack_fffffffffffffd60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffdd0),in_stack_fffffffffffffdc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd50);
    testing::Message::~Message((Message *)0x12f7ae);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12f806);
  local_1b4 = 0x2a;
  TVar5 = (Type)((ulong)local_1b0 >> 0x20);
  fmt::v5::format<char[15],char[7],int>
            ((char (*) [15])format_str,(char (*) [7])CONCAT17(uVar3,in_stack_fffffffffffffda0),
             (int *)in_stack_fffffffffffffd98);
  testing::internal::EqHelper<false>::Compare<char[17],std::__cxx11::string>
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
             (char (*) [17])CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
             in_stack_fffffffffffffd50);
  std::__cxx11::string::~string(local_1b0);
  uVar4 = testing::AssertionResult::operator_cast_to_bool(local_190);
  if (!(bool)uVar4) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd80);
    in_stack_fffffffffffffd68 =
         testing::AssertionResult::failure_message((AssertionResult *)0x12f8fe);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd80,TVar5,(char *)CONCAT17(uVar4,in_stack_fffffffffffffd70),
               (int)((ulong)in_stack_fffffffffffffd68 >> 0x20),in_stack_fffffffffffffd60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffdd0),in_stack_fffffffffffffdc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd50);
    testing::Message::~Message((Message *)0x12f95b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12f9b3);
  actual_expression = local_1f8;
  fmt::v5::format<char[10],char[5],char[4]>
            ((char (*) [10])format_str,(char (*) [5])CONCAT17(uVar3,in_stack_fffffffffffffda0),
             in_stack_fffffffffffffd98);
  testing::internal::EqHelper<false>::Compare<char[12],std::__cxx11::string>
            (in_stack_fffffffffffffd68,(char *)actual_expression,
             (char (*) [12])CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
             in_stack_fffffffffffffd50);
  line = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
  std::__cxx11::string::~string(local_1f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd80);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x12fa9f)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd80,TVar5,(char *)CONCAT17(uVar4,in_stack_fffffffffffffd70),
               line,(char *)actual_expression);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffdd0),in_stack_fffffffffffffdc8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x12fafc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12fb51);
  return;
}

Assistant:

TEST(FormatterTest, ArgsInDifferentPositions) {
  EXPECT_EQ("42", format("{0}", 42));
  EXPECT_EQ("before 42", format("before {0}", 42));
  EXPECT_EQ("42 after", format("{0} after", 42));
  EXPECT_EQ("before 42 after", format("before {0} after", 42));
  EXPECT_EQ("answer = 42", format("{0} = {1}", "answer", 42));
  EXPECT_EQ("42 is the answer", format("{1} is the {0}", "answer", 42));
  EXPECT_EQ("abracadabra", format("{0}{1}{0}", "abra", "cad"));
}